

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.h
# Opt level: O0

cmCommand * __thiscall cmBuildNameCommand::Clone(cmBuildNameCommand *this)

{
  cmCommand *this_00;
  cmBuildNameCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmBuildNameCommand((cmBuildNameCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmBuildNameCommand; }